

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_loop_expand.cpp
# Opt level: O0

void optimization::loop_expand::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  Rewriter *this;
  pointer pIVar5;
  type pIVar6;
  long lVar7;
  size_type sVar8;
  int *in_RDX;
  loop_info *in_RSI;
  PhiInst *phiInst;
  Inst *i;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst_1;
  iterator iter;
  mapped_type *end_loop_blk;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  VarId new_change_var;
  int times;
  Rewriter rwt;
  mapped_type *loop_start;
  undefined4 in_stack_fffffffffffff558;
  uint32_t in_stack_fffffffffffff55c;
  iterator in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff568;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  in_stack_fffffffffffff570;
  const_iterator in_stack_fffffffffffff578;
  JumpInstruction *in_stack_fffffffffffff580;
  Function *in_stack_fffffffffffff588;
  BasicBlk *in_stack_fffffffffffff590;
  MirFunction *in_stack_fffffffffffff598;
  Rewriter *in_stack_fffffffffffff5a0;
  VarId *in_stack_fffffffffffff5a8;
  OpInst *in_stack_fffffffffffff5b0;
  PhiInst *this_00;
  Timestamp *in_stack_fffffffffffff5e8;
  JumpInstruction *this_01;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  Severity *in_stack_fffffffffffff658;
  ostream *in_stack_fffffffffffff660;
  VarId *new_change_var_00;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_7b8;
  mapped_type *local_7b0;
  undefined1 local_7a8 [80];
  reference local_758;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_750;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_748;
  undefined1 *local_740;
  undefined1 local_738 [44];
  int local_70c;
  JumpInstruction local_6f0 [7];
  allocator<char> local_549;
  string local_548 [39];
  allocator<char> local_521;
  string local_520 [120];
  time_point_sys_clock local_4a8;
  Timestamp local_4a0 [3];
  undefined1 local_451;
  allocator<char> local_389;
  string local_388 [39];
  allocator<char> local_361;
  string local_360 [120];
  time_point_sys_clock local_2e8;
  Timestamp local_2e0 [3];
  undefined1 local_291;
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [120];
  time_point_sys_clock local_180;
  Timestamp local_178;
  VarId local_160 [3];
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [120];
  time_point_sys_clock local_88;
  Timestamp local_80 [3];
  undefined1 local_21;
  mapped_type *local_20;
  loop_info *local_10;
  
  local_10 = in_RSI;
  local_20 = std::
             map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
             ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                   *)in_stack_fffffffffffff580,(key_type *)in_stack_fffffffffffff578._M_current);
  local_21 = 0;
  AixLog::operator<<(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  AixLog::Tag::Tag((Tag *)0x1e410c);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff590,(Tag *)in_stack_fffffffffffff588);
  local_88.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_80,&local_88);
  AixLog::operator<<((ostream *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff570._M_current,in_stack_fffffffffffff568,
             (string *)in_stack_fffffffffffff560._M_current,
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  poVar4 = std::operator<<(poVar4,"expand loop starts at  ");
  this = (Rewriter *)std::ostream::operator<<(poVar4,*in_RDX);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff560._M_current);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  AixLog::Timestamp::~Timestamp(local_80);
  AixLog::Tag::~Tag((Tag *)0x1e42c7);
  local_12a = 0;
  AixLog::operator<<(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  new_change_var_00 = local_160;
  AixLog::Tag::Tag((Tag *)0x1e4300);
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff590,(Tag *)in_stack_fffffffffffff588)
  ;
  iVar3 = (int)((ulong)poVar4 >> 0x20);
  local_180.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(&local_178,&local_180);
  AixLog::operator<<((ostream *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff570._M_current,in_stack_fffffffffffff568,
             (string *)in_stack_fffffffffffff560._M_current,
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  std::operator<<(poVar4,"init_val: ");
  mir::inst::VarId::VarId
            (in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::Value::Value((Value *)in_stack_fffffffffffff560._M_current,in_stack_fffffffffffff55c);
  mir::inst::AssignInst::AssignInst
            ((AssignInst *)in_stack_fffffffffffff5a0,(VarId *)in_stack_fffffffffffff598,
             (Value *)in_stack_fffffffffffff590);
  poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff560._M_current,
                               (Displayable *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  mir::inst::AssignInst::~AssignInst((AssignInst *)0x1e44bd);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff560._M_current);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator(&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  AixLog::Timestamp::~Timestamp(&local_178);
  AixLog::Tag::~Tag((Tag *)0x1e4518);
  local_291 = 0;
  AixLog::operator<<(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  AixLog::Tag::Tag((Tag *)0x1e4551);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff590,(Tag *)in_stack_fffffffffffff588);
  local_2e8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_2e0,&local_2e8);
  AixLog::operator<<((ostream *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff570._M_current,in_stack_fffffffffffff568,
             (string *)in_stack_fffffffffffff560._M_current,
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  std::operator<<(poVar4,"change : ");
  mir::inst::VarId::VarId
            (in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::VarId::VarId
            (in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::Value::Value
            ((Value *)in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::Value::Value((Value *)in_stack_fffffffffffff560._M_current,in_stack_fffffffffffff55c);
  mir::inst::OpInst::OpInst
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,(Value *)in_stack_fffffffffffff5a0,
             (Value *)in_stack_fffffffffffff598,(Op)((ulong)in_stack_fffffffffffff590 >> 0x20));
  poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff560._M_current,
                               (Displayable *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  mir::inst::OpInst::~OpInst((OpInst *)0x1e475e);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff560._M_current);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  AixLog::Timestamp::~Timestamp(local_2e0);
  AixLog::Tag::~Tag((Tag *)0x1e47b9);
  local_451 = 0;
  AixLog::operator<<(in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  AixLog::Tag::Tag((Tag *)0x1e47f2);
  AixLog::operator<<((ostream *)in_stack_fffffffffffff590,(Tag *)in_stack_fffffffffffff588);
  local_4a8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_4a0,&local_4a8);
  AixLog::operator<<((ostream *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                     in_stack_fffffffffffff5e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff5a0,(char *)in_stack_fffffffffffff598,
             (allocator<char> *)in_stack_fffffffffffff590);
  AixLog::Function::Function
            ((Function *)in_stack_fffffffffffff570._M_current,in_stack_fffffffffffff568,
             (string *)in_stack_fffffffffffff560._M_current,
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  poVar4 = AixLog::operator<<((ostream *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
  std::operator<<(poVar4,"continue when: ");
  mir::inst::VarId::VarId(in_stack_fffffffffffff560._M_current,in_stack_fffffffffffff55c);
  mir::inst::VarId::VarId
            (in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::Value::Value
            ((Value *)in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::Value::Value((Value *)in_stack_fffffffffffff560._M_current,in_stack_fffffffffffff55c);
  mir::inst::OpInst::OpInst
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,(Value *)in_stack_fffffffffffff5a0,
             (Value *)in_stack_fffffffffffff598,(Op)((ulong)in_stack_fffffffffffff590 >> 0x20));
  poVar4 = prelude::operator<<((ostream *)in_stack_fffffffffffff560._M_current,
                               (Displayable *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  mir::inst::OpInst::~OpInst((OpInst *)0x1e49f3);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffff560._M_current);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  AixLog::Timestamp::~Timestamp(local_4a0);
  AixLog::Tag::~Tag((Tag *)0x1e4a4e);
  std::pair<mir::inst::VarId,_mir::inst::VarId>::pair<mir::inst::VarId_&,_mir::inst::VarId_&,_true>
            ((pair<mir::inst::VarId,_mir::inst::VarId> *)in_stack_fffffffffffff570._M_current,
             (VarId *)in_stack_fffffffffffff568,in_stack_fffffffffffff560._M_current);
  mir::inst::VarId::VarId
            (in_stack_fffffffffffff560._M_current,
             (VarId *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  Rewriter::Rewriter(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                     (pair<mir::inst::VarId,_mir::inst::VarId> *)in_stack_fffffffffffff588,
                     (VarId *)in_stack_fffffffffffff580);
  std::optional<mir::inst::VarId>::optional((optional<mir::inst::VarId> *)0x1e4b0e);
  mir::inst::JumpInstruction::JumpInstruction
            (in_stack_fffffffffffff580,
             (JumpInstructionKind)((ulong)in_stack_fffffffffffff578._M_current >> 0x20),
             (int)in_stack_fffffffffffff578._M_current,
             (int)((ulong)in_stack_fffffffffffff570._M_current >> 0x20),
             (optional<mir::inst::VarId> *)in_stack_fffffffffffff568,
             (JumpKind)((ulong)in_stack_fffffffffffff560._M_current >> 0x20));
  this_01 = local_6f0;
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)in_stack_fffffffffffff560._M_current,
             (JumpInstruction *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::JumpInstruction::~JumpInstruction(this_01);
  local_70c = loop_info::get_times(local_10);
  mir::inst::VarId::VarId(in_stack_fffffffffffff560._M_current);
  Rewriter::get_insts(this,iVar3,new_change_var_00);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)0x1e4bd1);
  local_740 = local_738;
  local_748._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  local_750 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                             *)in_stack_fffffffffffff560._M_current,
                            (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558)), bVar1
        ) {
    local_758 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                ::operator*(&local_748);
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 *)in_stack_fffffffffffff560._M_current,
                (value_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator++(&local_748);
  }
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
        *)in_stack_fffffffffffff580,(key_type *)in_stack_fffffffffffff578._M_current);
  std::set<int,_std::less<int>,_std::allocator<int>_>::erase
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560._M_current,
             (key_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  this_00 = (PhiInst *)local_7a8;
  std::optional<mir::inst::VarId>::optional((optional<mir::inst::VarId> *)0x1e511e);
  mir::inst::JumpInstruction::JumpInstruction
            (in_stack_fffffffffffff580,
             (JumpInstructionKind)((ulong)in_stack_fffffffffffff578._M_current >> 0x20),
             (int)in_stack_fffffffffffff578._M_current,
             (int)((ulong)in_stack_fffffffffffff570._M_current >> 0x20),
             (optional<mir::inst::VarId> *)in_stack_fffffffffffff568,
             (JumpKind)((ulong)in_stack_fffffffffffff560._M_current >> 0x20));
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)in_stack_fffffffffffff560._M_current,
             (JumpInstruction *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mir::inst::JumpInstruction::~JumpInstruction((JumpInstruction *)(local_7a8 + 0x18));
  std::
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  ::erase((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
           *)in_stack_fffffffffffff560._M_current,
          (key_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  local_7b0 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff580,(key_type *)in_stack_fffffffffffff578._M_current);
  local_7b8._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  while( true ) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)in_stack_fffffffffffff560._M_current,
                       (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    bVar1 = false;
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
      ::operator->(&local_7b8);
      pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::get
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          in_stack_fffffffffffff560._M_current);
      iVar3 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
      bVar1 = iVar3 == 7;
    }
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator*(&local_7b8);
    pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        in_stack_fffffffffffff560._M_current);
    if (pIVar6 == (type)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = __dynamic_cast(pIVar6,&mir::inst::Inst::typeinfo,&mir::inst::PhiInst::typeinfo,0);
    }
    mir::inst::PhiInst::useVars(this_00);
    sVar8 = std::
            set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
            count((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                   *)in_stack_fffffffffffff570._M_current,(key_type *)in_stack_fffffffffffff568);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::~set
              ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)0x1e531c);
    if (sVar8 != 0) {
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      std::
      find<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,mir::inst::VarId>
                ((__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  )in_stack_fffffffffffff578._M_current,in_stack_fffffffffffff570,
                 (VarId *)in_stack_fffffffffffff568);
      __gnu_cxx::
      __normal_iterator<mir::inst::VarId_const*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
      ::__normal_iterator<mir::inst::VarId*>
                ((__normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)in_stack_fffffffffffff560._M_current,
                 (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                  *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_fffffffffffff570._M_current,in_stack_fffffffffffff578);
    }
    if (local_70c != 0) {
      mir::inst::PhiInst::useVars(this_00);
      in_stack_fffffffffffff578._M_current =
           (VarId *)std::
                    set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    ::count(in_stack_fffffffffffff570._M_current,
                            (key_type *)in_stack_fffffffffffff568);
      std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
      ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
           0x1e544c);
      if (in_stack_fffffffffffff578._M_current != (VarId *)0x0) {
        in_stack_fffffffffffff568 = (string *)(lVar7 + 0x28);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        in_stack_fffffffffffff570 =
             std::
             find<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,mir::inst::VarId>
                       (in_stack_fffffffffffff578._M_current,in_stack_fffffffffffff570,
                        (VarId *)in_stack_fffffffffffff568);
        __gnu_cxx::
        __normal_iterator<mir::inst::VarId_const*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
        ::__normal_iterator<mir::inst::VarId*>
                  ((__normal_iterator<const_mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                    *)in_stack_fffffffffffff560._M_current,
                   (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                    *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
        in_stack_fffffffffffff560 =
             std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                       (in_stack_fffffffffffff570._M_current,in_stack_fffffffffffff578);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   in_stack_fffffffffffff570._M_current,(value_type *)in_stack_fffffffffffff568);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator++((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                  *)in_stack_fffffffffffff568,
                 (int)((ulong)in_stack_fffffffffffff560._M_current >> 0x20));
  }
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)in_stack_fffffffffffff570._M_current);
  Rewriter::~Rewriter((Rewriter *)0x1e557c);
  return;
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "expand loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: "
             << mir::inst::AssignInst(info.init_var.first, info.init_var.second)
             << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var.first, info.init_var.first,
                                  info.change_value, info.change_op)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var.first,
                                  info.in_value, info.in_op)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var.first}, info.change_var);
  blk.jump = mir::inst::JumpInstruction(mir::inst::JumpInstructionKind::Br,
                                        blk.jump.bb_false);
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  blk.inst.clear();
  for (auto& inst : insts) {
    loop_start.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::Br, loop_start.jump.bb_false);
  func.basic_blks.erase(blk.id);
  auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  for (auto iter = end_loop_blk.inst.begin();
       iter != end_loop_blk.inst.end() &&
       iter->get()->inst_kind() == mir::inst::InstKind::Phi;
       iter++) {
    auto& inst = *iter;
    auto& i = *inst;
    auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
    if (phiInst->useVars().count(info.change_var)) {
      phiInst->vars.erase(std::find(phiInst->vars.begin(), phiInst->vars.end(),
                                    info.change_var));
    }
    if (times) {
      if (phiInst->useVars().count(info.init_var.first)) {
        phiInst->vars.erase(std::find(
            phiInst->vars.begin(), phiInst->vars.end(), info.init_var.first));
        phiInst->vars.push_back(new_change_var);
      }
    }
  }
}